

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_getupvalue(lua_State *L,int funcindex,int n)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  int *piVar4;
  TValue *fi;
  char *pcVar5;
  TValue *val;
  ravi_type_map type;
  TString *usertype;
  TValue *local_28;
  ravi_type_map local_1c;
  TString *local_18;
  
  local_28 = (TValue *)0x0;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x646,"const char *lua_getupvalue(lua_State *, int, int)");
  }
  fi = index2addr(L,funcindex);
  pcVar5 = aux_upvalue(fi,n,&local_28,(CClosure **)0x0,(UpVal **)0x0,&local_1c,&local_18);
  if (pcVar5 != (char *)0x0) {
    pTVar3 = L->top;
    pTVar3->value_ = local_28->value_;
    uVar1 = local_28->tt_;
    pTVar3->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)((pTVar3->value_).gc)->tt ||
        ((L != (lua_State *)0x0 &&
         ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x649,"const char *lua_getupvalue(lua_State *, int, int)");
    }
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    if (L->ci->top < pTVar3 + 1) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x64a,"const char *lua_getupvalue(lua_State *, int, int)");
    }
  }
  piVar4 = *(int **)&L[-1].hookmask;
  *piVar4 = *piVar4 + -1;
  if (*piVar4 == 0) {
    return pcVar5;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x64c,"const char *lua_getupvalue(lua_State *, int, int)");
}

Assistant:

LUA_API const char *lua_getupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  ravi_type_map type;
  TString *usertype;
  TValue *val = NULL;  /* to avoid warnings */
  lua_lock(L);
  name = aux_upvalue(index2addr(L, funcindex), n, &val, NULL, NULL, &type, &usertype);
  if (name) {
    setobj2s(L, L->top, val);
    api_incr_top(L);
  }
  lua_unlock(L);
  return name;
}